

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

uint32_t Catch::generateRandomSeed(GenerateFrom from)

{
  time_t tVar1;
  int in_EDI;
  random_device rd;
  ReusableStringStream *in_stack_ffffffffffffec08;
  random_device *in_stack_ffffffffffffec10;
  ReusableStringStream *this;
  string *in_stack_ffffffffffffec30;
  random_device *in_stack_ffffffffffffec50;
  enable_if_t<sizeof(typename_random_device::result_type)_>__sizeof_unsigned_int___unsigned_int>
  local_4;
  
  if (in_EDI == 0) {
    tVar1 = time((time_t *)0x0);
    local_4 = (enable_if_t<sizeof(typename_random_device::result_type)_>__sizeof_unsigned_int___unsigned_int>
               )tVar1;
  }
  else {
    if (1 < in_EDI - 1U) {
      this = (ReusableStringStream *)&stack0xffffffffffffec30;
      ReusableStringStream::ReusableStringStream(this);
      ReusableStringStream::operator<<(this,(char (*) [26])in_stack_ffffffffffffec08);
      ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffec08);
      throw_domain_error(in_stack_ffffffffffffec30);
    }
    std::random_device::random_device(in_stack_ffffffffffffec50);
    local_4 = Detail::fillBitsFrom<unsigned_int,std::random_device>(in_stack_ffffffffffffec10);
    std::random_device::~random_device((random_device *)0x18d0e5);
  }
  return local_4;
}

Assistant:

std::uint32_t generateRandomSeed( GenerateFrom from ) {
        switch ( from ) {
        case GenerateFrom::Time:
            return static_cast<std::uint32_t>( std::time( nullptr ) );

        case GenerateFrom::Default:
        case GenerateFrom::RandomDevice: {
            std::random_device rd;
            return Detail::fillBitsFrom<std::uint32_t>( rd );
        }

        default:
            CATCH_ERROR("Unknown generation method");
        }
    }